

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O2

void compute_coord(int num_dims,int *strip_sizes,int target_rank,int *coord,int *dim_order,
                  bool *flipped_dim)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = 0;
  uVar4 = 0;
  if (0 < num_dims) {
    uVar4 = (ulong)(uint)num_dims;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    iVar1 = dim_order[uVar5];
    iVar2 = target_rank;
    lVar6 = (long)num_dims;
    while (lVar6 = lVar6 + -1, (long)uVar5 < lVar6) {
      iVar2 = iVar2 / strip_sizes[dim_order[lVar6]];
    }
    uVar3 = iVar2 % strip_sizes[iVar1];
    if (flipped_dim[iVar1] == false) {
      coord[iVar1] = coord[iVar1] + uVar3;
    }
    else {
      coord[iVar1] = coord[iVar1] + strip_sizes[iVar1] + ~uVar3;
    }
  }
  return;
}

Assistant:

void compute_coord(int num_dims, const int *strip_sizes, int target_rank, int *coord, const int *dim_order,
				   const bool *flipped_dim) {
  int curr_dim;
  for (int dim_index = 0; dim_index < num_dims; dim_index++) {
	curr_dim = dim_order[dim_index];
	int coord_component = target_rank;
	int strip_size = strip_sizes[curr_dim];

	for (int rem_dim_index = num_dims - 1; rem_dim_index > dim_index; rem_dim_index--) {
	  int rem_dim = dim_order[rem_dim_index];
	  coord_component /= strip_sizes[rem_dim];
	}

	if (flipped_dim[curr_dim]) {
	  coord[curr_dim] += strip_size - ((coord_component % strip_size) + 1);
	} else {
	  coord[curr_dim] += coord_component % strip_size;
	}
  }
}